

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_softmax<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  example *peVar1;
  pointer_____offset_0x10___ *local_68;
  float *local_60;
  pointer_____offset_0x10___ *local_58;
  float *local_50;
  pointer_____offset_0x10___ *local_48;
  float *local_40;
  pointer_____offset_0x10___ *local_38;
  float *local_30;
  
  LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  peVar1 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = (peVar1->pred).scalars._begin;
  local_60 = (peVar1->pred).scalars._end;
  local_58 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_68 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_38 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_48 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = local_60;
  local_30 = local_50;
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            (data->lambda,&local_58,&local_68);
  local_50 = (peVar1->pred).scalars._begin;
  local_60 = (peVar1->pred).scalars._end;
  local_58 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_68 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,1,&local_58,&local_68);
  return;
}

Assistant:

void predict_or_learn_softmax(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  generate_softmax(data.lambda, begin_scores(preds), end_scores(preds), begin_scores(preds), end_scores(preds));

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}